

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

int sengr_at(char *s,xchar x,xchar y)

{
  uint uVar1;
  char *pcVar2;
  engr *peVar3;
  
  uVar1 = 0;
  for (peVar3 = level->lev_engr; peVar3 != (engr *)0x0; peVar3 = peVar3->nxt_engr) {
    if ((peVar3->engr_x == x) && (peVar3->engr_y == y)) goto LAB_00198799;
  }
  peVar3 = (engr *)0x0;
LAB_00198799:
  if ((peVar3 != (engr *)0x0) &&
     ((peVar3->engr_type != '\x06' && (peVar3->engr_time <= (long)(ulong)moves)))) {
    pcVar2 = strstri(peVar3->engr_txt,s);
    uVar1 = (uint)(pcVar2 != (char *)0x0);
  }
  return uVar1;
}

Assistant:

int sengr_at(const char *s, xchar x, xchar y)
{
	struct engr *ep = engr_at(level, x,y);

	return (ep && ep->engr_type != HEADSTONE &&
		ep->engr_time <= moves && strstri(ep->engr_txt, s) != 0);
}